

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O3

void jsoncons::jsonpointer::
     add_if_absent<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,char_const(&)[4]>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
               basic_json_pointer<char> *location,char (*value) [4],bool create_if_missing)

{
  jsonpointer *this;
  undefined8 extraout_RAX;
  error_code ec;
  error_code local_38;
  
  local_38._M_value = 0;
  local_38._M_cat = (error_category *)std::_V2::system_category();
  add_if_absent<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,char_const(&)[4]>
            (root,location,value,create_if_missing,&local_38);
  if (local_38._M_value == 0) {
    return;
  }
  this = (jsonpointer *)__cxa_allocate_exception(0x28);
  jsonpointer_error::jsonpointer_error((jsonpointer_error *)this,&local_38);
  add_if_absent<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,char_const(&)[4]>
            (this);
  __cxa_free_exception(this);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void add_if_absent(Json& root, 
                const basic_json_pointer<typename Json::char_type>& location, 
                T&& value,
                bool create_if_missing = false)
    {
        std::error_code ec;
        add_if_absent(root, location, std::forward<T>(value), create_if_missing, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(jsonpointer_error(ec));
        }
    }